

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpluginloader.cpp
# Opt level: O3

void __thiscall QPluginLoader::setFileName(QPluginLoader *this,QString *fileName)

{
  QArrayData *pQVar1;
  QArrayData *pQVar2;
  int *piVar3;
  undefined1 this_00 [8];
  undefined8 uVar4;
  Data *pDVar5;
  bool bVar6;
  bool bVar7;
  CutResult CVar8;
  qsizetype qVar9;
  QString *pQVar10;
  QLoggingCategory *pQVar11;
  QLibraryPrivate *pQVar12;
  long lVar13;
  storage_type *psVar14;
  QString *pQVar15;
  QFlagsStorage<QLibrary::LoadHint> loadHints;
  QString *pQVar16;
  char16_t *pcVar17;
  long lVar18;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QFileInfo fi;
  QString local_118;
  undefined1 local_100 [8];
  undefined1 local_f8 [24];
  QString *pQStack_e0;
  char16_t *local_d8;
  QStringView local_c8;
  QStringView local_b8;
  QArrayDataPointer<QString> local_a8;
  QArrayDataPointer<QString> local_88;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QStringView_&>,_QStringView_&>,_const_QStringView_&>,_const_QString_&>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = this->d;
  if (pQVar12 == (QLibraryPrivate *)0x0) {
    loadHints.i = 8;
  }
  else {
    loadHints.i = (pQVar12->loadHintsInt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                  _q_value.super___atomic_base<int>._M_i;
    QLibraryPrivate::release(pQVar12);
    this->d = (QLibraryPrivate *)0x0;
    this->did_load = false;
  }
  local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  bVar6 = QDir::isRelativePath(fileName);
  if (!bVar6) {
    local_68.a.a.a.a.a._0_4_ = 0xaaaaaaaa;
    local_68.a.a.a.a.a._4_4_ = 0xaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_68,fileName);
    bVar7 = QFileInfo::isFile((QFileInfo *)&local_68);
    if (bVar7) {
      QFileInfo::canonicalFilePath(&local_118,(QFileInfo *)&local_68);
      QFileInfo::~QFileInfo((QFileInfo *)&local_68);
      goto LAB_002da171;
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_68);
  }
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.a.a.a.a.a._0_4_ = 0;
  local_68.a.a.a.a.a._4_4_ = 0;
  local_68.a.a.a.a.b = L'\0';
  local_68.a.a.a.a._10_2_ = 0;
  local_68.a.a.a.a._12_4_ = 0;
  local_68.a.a.a.b._0_4_ = 0;
  local_68.a.a.a.b._4_4_ = 0;
  QLibraryPrivate::suffixes_sys((QStringList *)&local_a8,(QString *)&local_68);
  piVar3 = (int *)CONCAT44(local_68.a.a.a.a.a._4_4_,local_68.a.a.a.a.a._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_68.a.a.a.a.a._4_4_,local_68.a.a.a.a.a._0_4_),2,0x10);
    }
  }
  local_68.a.a.a.a.a._0_4_ = 0;
  local_68.a.a.a.a.a._4_4_ = 0;
  local_68.a.a.a.a.b = L'\0';
  local_68.a.a.a.a._10_2_ = 0;
  local_68.a.a.a.a._12_4_ = 0;
  local_68.a.a.a.b._0_4_ = 0;
  local_68.a.a.a.b._4_4_ = 0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_a8,0,(QString *)&local_68);
  piVar3 = (int *)CONCAT44(local_68.a.a.a.a.a._4_4_,local_68.a.a.a.a.a._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_68.a.a.a.a.a._4_4_,local_68.a.a.a.a.a._0_4_),2,0x10);
    }
  }
  qVar9 = QString::lastIndexOf(fileName,(QChar)0x2f,-1,CaseSensitive);
  local_b8.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  pcVar17 = (fileName->d).ptr;
  pQVar1 = (QArrayData *)(qVar9 + 1);
  local_88.d = (Data *)0xffffffffffffffff;
  local_68.a.a.a.a.a = (QString *)pQVar1;
  CVar8 = QtPrivate::QContainerImplHelper::mid
                    ((fileName->d).size,(qsizetype *)&local_68,(qsizetype *)&local_88);
  if (CVar8 == Null) {
    local_b8.m_size = 0;
    pcVar17 = (char16_t *)0x0;
  }
  else {
    pcVar17 = pcVar17 + (long)local_68.a.a.a.a.a;
    local_b8.m_size = (qsizetype)local_88.d;
  }
  local_b8.m_data = pcVar17;
  if (bVar6) {
    local_c8.m_data = (fileName->d).ptr;
    pQVar2 = (QArrayData *)(fileName->d).size;
    local_c8.m_size = (qsizetype)pQVar1;
    if (pQVar2 < pQVar1) {
      local_c8.m_size = (qsizetype)pQVar2;
    }
    local_f8._16_8_ = (char *)0x0;
    pQStack_e0 = (QString *)0x0;
    local_d8 = (char16_t *)0x0;
    QCoreApplication::libraryPaths();
    qVar9 = local_88.size;
    pQVar10 = local_88.ptr;
    pDVar5 = local_88.d;
    pcVar17 = local_d8;
    pQVar16 = pQStack_e0;
    uVar4 = local_f8._16_8_;
    local_88.size = 0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (QString *)0x0;
    local_f8._16_8_ = pDVar5;
    pQStack_e0 = pQVar10;
    local_68.a.a.a.a.a._0_4_ = (undefined4)uVar4;
    local_68.a.a.a.a.a._4_4_ = SUB84(uVar4,4);
    local_68.a.a.a.a.b = (char16_t)pQVar16;
    local_68.a.a.a.a._10_2_ = SUB82((ulong)pQVar16 >> 0x10,0);
    local_68.a.a.a.a._12_4_ = SUB84((ulong)pQVar16 >> 0x20,0);
    local_d8 = (char16_t *)qVar9;
    local_68.a.a.a.b._0_4_ = SUB84(pcVar17,0);
    local_68.a.a.a.b._4_4_ = (undefined4)((ulong)pcVar17 >> 0x20);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_68);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  }
  else {
    local_c8.m_size = 0;
    local_c8.m_data = (char16_t *)0x0;
    local_f8._16_8_ = (QArrayData *)0x0;
    pQStack_e0 = (QString *)0x0;
    local_d8 = (char16_t *)0x0;
    QString::left((QString *)&local_68,fileName,qVar9);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)(local_f8 + 0x10),(qsizetype)local_d8,
               (QString *)&local_68);
    QList<QString>::end((QList<QString> *)(local_f8 + 0x10));
    if ((QArrayData *)local_68.a.a.a.a.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_68.a.a.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_68.a.a.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_68.a.a.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate((QArrayData *)local_68.a.a.a.a.a,2,0x10);
      }
    }
  }
  if (local_d8 != (char16_t *)0x0) {
    pQVar10 = pQStack_e0 + (long)local_d8;
    pQVar16 = pQStack_e0;
    do {
      lVar13 = 0;
      do {
        local_f8._0_8_ = *(undefined8 *)(&DAT_0069bce8 + lVar13);
        local_f8._8_8_ = *(undefined8 *)(&UNK_0069bcf0 + lVar13);
        if ((undefined1 *)local_a8.size != (undefined1 *)0x0) {
          lVar18 = local_a8.size * 0x18;
          pQVar15 = local_a8.ptr;
          do {
            local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            local_68.a.a.a.a.a._0_4_ = SUB84(pQVar16,0);
            local_68.a.a.a.a.a._4_4_ = (undefined4)((ulong)pQVar16 >> 0x20);
            local_68.a.a.a.a.b = L'/';
            local_68.a.a.a.b = &local_c8;
            local_68.a.a.b = (QStringView *)local_f8;
            local_68.a.b = &local_b8;
            local_68.b = pQVar15;
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QStringView_&>,_QStringView_&>,_const_QStringView_&>,_const_QString_&>
            ::convertTo<QString>(&local_118,&local_68);
            pQVar11 = QtPrivateLogging::qt_lcDebugPlugins();
            if (((pQVar11->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
              local_68.a.a.b = (QStringView *)pQVar11->name;
              local_68.a.a.a.a.a._0_4_ = 2;
              psVar14 = (storage_type *)((long)&local_68.a.a.a.a.a + 4);
              local_68.a.a.a.a.a._4_4_ = 0;
              local_68.a.a.a.a.b = L'\0';
              local_68.a.a.a.a._10_2_ = 0;
              local_68.a.a.a.a._12_4_ = 0;
              local_68.a.a.a.b._0_4_ = 0;
              local_68.a.a.a.b._4_4_ = 0;
              QMessageLogger::debug((QMessageLogger *)local_100);
              this_00 = local_100;
              ba.m_data = psVar14;
              ba.m_size = (qsizetype)"Trying...";
              QString::fromUtf8((QString *)&local_88,(QString *)0x9,ba);
              ::QTextStream::operator<<((QTextStream *)this_00,(QString *)&local_88);
              if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
                }
              }
              if (*(bool *)((long)local_100 + 0x30) == true) {
                ::QTextStream::operator<<((QTextStream *)local_100,' ');
              }
              pcVar17 = local_118.d.ptr;
              if ((QChar *)local_118.d.ptr == (QChar *)0x0) {
                pcVar17 = &QString::_empty;
              }
              QDebug::putString((QDebug *)local_100,(QChar *)pcVar17,local_118.d.size);
              if (*(bool *)((long)local_100 + 0x30) == true) {
                ::QTextStream::operator<<((QTextStream *)local_100,' ');
              }
              QDebug::~QDebug((QDebug *)local_100);
            }
            QFileInfo::QFileInfo((QFileInfo *)&local_68,&local_118);
            bVar6 = QFileInfo::isFile((QFileInfo *)&local_68);
            QFileInfo::~QFileInfo((QFileInfo *)&local_68);
            if (bVar6) goto LAB_002da15a;
            if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
              }
            }
            pQVar15 = pQVar15 + 1;
            lVar18 = lVar18 + -0x18;
          } while (lVar18 != 0);
        }
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x20);
      pQVar16 = pQVar16 + 1;
      pcVar17 = (char16_t *)0x0;
    } while (pQVar16 != pQVar10);
  }
  pQVar11 = QtPrivateLogging::qt_lcDebugPlugins();
  psVar14 = (storage_type *)CONCAT71((int7)((ulong)pcVar17 >> 8),*(byte *)&pQVar11->field_2);
  if ((*(byte *)&pQVar11->field_2 & 1) != 0) {
    local_68.a.a.b = (QStringView *)pQVar11->name;
    local_68.a.a.a.a.a._0_4_ = 2;
    local_68.a.a.a.a.a._4_4_ = 0;
    local_68.a.a.a.a.b = L'\0';
    local_68.a.a.a.a._10_2_ = 0;
    local_68.a.a.a.a._12_4_ = 0;
    local_68.a.a.a.b._0_4_ = 0;
    local_68.a.a.a.b._4_4_ = 0;
    QMessageLogger::debug((QMessageLogger *)local_f8);
    pcVar17 = (fileName->d).ptr;
    if ((QChar *)pcVar17 == (QChar *)0x0) {
      pcVar17 = &QString::_empty;
    }
    QDebug::putString((QDebug *)local_f8,(QChar *)pcVar17,(fileName->d).size);
    if (*(bool *)(local_f8._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_f8._0_8_,' ');
    }
    uVar4 = local_f8._0_8_;
    ba_00.m_data = psVar14;
    ba_00.m_size = (qsizetype)"not found";
    QString::fromUtf8((QString *)&local_88,(QString *)0x9,ba_00);
    ::QTextStream::operator<<((QTextStream *)uVar4,(QString *)&local_88);
    if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(bool *)(local_f8._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_f8._0_8_,' ');
    }
    QDebug::~QDebug((QDebug *)local_f8);
  }
  local_118.d.d = (Data *)0x0;
  local_118.d.ptr = (char16_t *)0x0;
  local_118.d.size = 0;
LAB_002da15a:
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)(local_f8 + 0x10));
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
LAB_002da171:
  local_68.a.a.a.a.a._0_4_ = 0;
  local_68.a.a.a.a.a._4_4_ = 0;
  local_68.a.a.a.a.b = L'\0';
  local_68.a.a.a.a._10_2_ = 0;
  local_68.a.a.a.a._12_4_ = 0;
  local_68.a.a.a.b._0_4_ = 0;
  local_68.a.a.a.b._4_4_ = 0;
  pQVar12 = QLibraryPrivate::findOrCreate(&local_118,(QString *)&local_68,(LoadHints)loadHints.i);
  this->d = pQVar12;
  piVar3 = (int *)CONCAT44(local_68.a.a.a.a.a._4_4_,local_68.a.a.a.a.a._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_68.a.a.a.a.a._4_4_,local_68.a.a.a.a.a._0_4_),2,0x10);
    }
  }
  if ((undefined1 *)local_118.d.size != (undefined1 *)0x0) {
    QLibraryPrivate::updatePluginState(this->d);
  }
  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPluginLoader::setFileName(const QString &fileName)
{
#if defined(QT_SHARED)
    QLibrary::LoadHints lh = defaultLoadHints;
    if (d) {
        lh = d->loadHints();
        d->release();
        d = nullptr;
        did_load = false;
    }

    const QString fn = locatePlugin(fileName);

    d = QLibraryPrivate::findOrCreate(fn, QString(), lh);
    if (!fn.isEmpty())
        d->updatePluginState();

#else
    qCWarning(qt_lcDebugPlugins, "Cannot load '%ls' into a statically linked Qt library.",
              qUtf16Printable(fileName));
#endif
}